

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O1

void avro::parsing::testCodec<avro::parsing::BinaryEncoderResolvingDecoderFactory>(TestData *td)

{
  char *pcVar1;
  undefined1 *puVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  auto_ptr<avro::OutputStream> p;
  auto_ptr<avro::InputStream> in;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  ValidSchema vs;
  undefined1 auStack_238 [12];
  int local_22c;
  auto_ptr<avro::OutputStream> local_228;
  int local_21c;
  string local_218;
  undefined7 uStack_217;
  long local_208 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  OutputStream *local_1e0;
  ValidSchema local_1d8;
  EncoderPtr local_1c8 [7];
  ios_base local_158 [264];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  testCodec<avro::parsing::BinaryEncoderResolvingDecoderFactory>::testNo =
       testCodec<avro::parsing::BinaryEncoderResolvingDecoderFactory>::testNo + 1;
  makeValidSchema((parsing *)&local_1d8,td->schema);
  iVar5 = 0;
  do {
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228._M_ptr = (OutputStream *)0x0;
    avro::binaryEncoder();
    local_21c = iVar5;
    testEncoder(local_1c8,td->calls,&local_1f8,&local_228);
    boost::detail::shared_count::~shared_count(&local_1c8[0].pn);
    uVar6 = td->depth;
    local_22c = 0;
    local_1e0 = local_228._M_ptr;
    uVar4 = 0;
    do {
      memset(local_1c8,0,0x198);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      local_48 = 0;
      local_40 = 0;
      local_50 = &local_40;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Test: ",6);
      std::ostream::operator<<
                (local_1c8,testCodec<avro::parsing::BinaryEncoderResolvingDecoderFactory>::testNo);
      local_218 = (string)0x20;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_218,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8," schema: ",9);
      pcVar1 = td->schema;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)auStack_238 + (int)*(undefined8 *)(local_1c8[0].px + -0x18) + 0x70);
      }
      else {
        sVar3 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pcVar1,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8," calls: ",8);
      pcVar1 = td->calls;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)auStack_238 + (int)*(undefined8 *)(local_1c8[0].px + -0x18) + 0x70);
      }
      else {
        sVar3 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pcVar1,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8," skip-level: ",0xd);
      uVar6 = uVar6 + local_22c;
      std::ostream::_M_insert<unsigned_long>((ulong)local_1c8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&local_50,&local_218);
      if ((long *)CONCAT71(uStack_217,local_218) != local_208) {
        operator_delete((long *)CONCAT71(uStack_217,local_218),local_208[0] + 1);
      }
      puVar2 = local_50;
      boost::unit_test::anon_unknown_0::s_log_impl();
      std::__cxx11::string::_M_replace
                (0x1dc2b0,0,
                 (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                         m_message._M_string_length,(ulong)puVar2);
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
      ;
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end =
           "";
      boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x279;
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      avro::memoryInputStream((OutputStream *)&local_218);
      BinaryEncoderResolvingDecoderFactory::newDecoder
                ((BinaryEncoderResolvingDecoderFactory *)local_1c8,&local_1d8);
      testDecoder((DecoderPtr *)local_1c8,&local_1f8,(InputStream *)CONCAT71(uStack_217,local_218),
                  td->calls,uVar6);
      boost::detail::shared_count::~shared_count(&local_1c8[0].pn);
      if ((long *)CONCAT71(uStack_217,local_218) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(uStack_217,local_218) + 8))();
      }
      iVar5 = local_21c;
      uVar4 = uVar4 + 1;
      uVar6 = td->depth;
      local_22c = local_22c + -1;
    } while (uVar4 <= uVar6);
    if (local_228._M_ptr != (OutputStream *)0x0) {
      (**(code **)(*(long *)local_228._M_ptr + 8))();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1f8);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 10);
  boost::detail::shared_count::~shared_count(&local_1d8.root_.pn);
  return;
}

Assistant:

void testCodec(const TestData& td) {
    static int testNo = 0;
    testNo++;

    ValidSchema vs = makeValidSchema(td.schema);

    for (unsigned int i = 0; i < count; ++i) {
        vector<string> v;
        auto_ptr<OutputStream> p;
        testEncoder(CodecFactory::newEncoder(vs), td.calls, v, p);
        // dump(*p);

        for (unsigned int i = 0; i <= td.depth; ++i) {
            unsigned int skipLevel = td.depth - i;
            /*
            std::cout << "Test: " << testNo << ' '
                << " schema: " << td.schema
                << " calls: " << td.calls
                << " skip-level: " << skipLevel << std::endl;
                */
            BOOST_TEST_CHECKPOINT("Test: " << testNo << ' '
                << " schema: " << td.schema
                << " calls: " << td.calls
                << " skip-level: " << skipLevel);
            auto_ptr<InputStream> in = memoryInputStream(*p);
            testDecoder(CodecFactory::newDecoder(vs), v, *in,
                td.calls, skipLevel);
        }
    }
}